

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O2

void __thiscall pg::QPTSolver::liftloop(QPTSolver *this)

{
  Game *pGVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  Error *this_00;
  int i;
  long lVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  int *piVar12;
  int v;
  uint uVar13;
  ulong uVar14;
  _label_vertex local_40;
  
  piVar12 = this->pm_nodes;
  uVar14 = ((this->super_Solver).game)->n_vertices;
  for (lVar8 = 0; lVar9 = (long)this->k * uVar14, lVar9 - lVar8 != 0 && lVar8 <= lVar9;
      lVar8 = lVar8 + 1) {
    piVar12[lVar8] = -1;
  }
  piVar12 = this->strategy;
  for (uVar10 = 0; (~((long)uVar14 >> 0x3f) & uVar14) != uVar10; uVar10 = uVar10 + 1) {
    piVar12[uVar10] = -1;
  }
  uVar14 = uVar14 & 0xffffffff;
  while( true ) {
    uVar14 = uVar14 - 1;
    uVar13 = (uint)uVar14;
    if ((int)uVar13 < 0) break;
    if ((((this->super_Solver).disabled)->_bits[uVar13 >> 6 & 0x1ffffff] >> (uVar14 & 0x3f) & 1) ==
        0) {
      this->lift_attempt = this->lift_attempt + 1;
      bVar2 = lift(this,uVar13,-1);
      if (bVar2) {
        this->lift_count = this->lift_count + 1;
        todo_push(this,uVar13);
      }
    }
  }
  while ((this->todo).pointer != 0) {
    iVar4 = todo_pop(this);
    pGVar1 = (this->super_Solver).game;
    piVar12 = pGVar1->_inedges + pGVar1->_firstins[iVar4];
    while( true ) {
      iVar3 = *piVar12;
      uVar14 = (ulong)iVar3;
      if (uVar14 == 0xffffffffffffffff) break;
      if ((((this->super_Solver).disabled)->_bits[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) {
        this->lift_attempt = this->lift_attempt + 1;
        bVar2 = lift(this,iVar3,iVar4);
        if (bVar2) {
          this->lift_count = this->lift_count + 1;
          todo_push(this,iVar3);
        }
      }
      piVar12 = piVar12 + 1;
    }
  }
  if ((this->super_Solver).trace != 0) {
    for (uVar14 = 0; (long)uVar14 < ((this->super_Solver).game)->n_vertices; uVar14 = uVar14 + 1) {
      if ((((this->super_Solver).disabled)->_bits[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) {
        iVar4 = this->k;
        piVar12 = this->pm_nodes;
        iVar5 = (int)uVar14;
        poVar7 = std::operator<<((this->super_Solver).logger,"\x1b[1m");
        local_40.g = (this->super_Solver).game;
        local_40.v = iVar5;
        poVar7 = operator<<(poVar7,&local_40);
        iVar3 = Solver::owner(&this->super_Solver,iVar5);
        pcVar11 = " (odd)";
        if (iVar3 == 0) {
          pcVar11 = " (even)";
        }
        poVar7 = std::operator<<(poVar7,pcVar11);
        std::operator<<(poVar7,"\x1b[m:");
        pm_stream((this->super_Solver).logger,piVar12 + (long)iVar4 * (long)iVar5,this->k);
        uVar13 = piVar12[(long)iVar4 * (long)iVar5];
        if ((uVar13 == 0xffffffff) || ((uVar13 & 1) != this->pl)) {
          iVar4 = Solver::owner(&this->super_Solver,iVar5);
          if (iVar4 != this->pl) {
            poVar7 = (this->super_Solver).logger;
            if (this->strategy[uVar14] == -1) {
              std::operator<<(poVar7," no strategy!");
            }
            else {
              poVar7 = std::operator<<(poVar7," => ");
              local_40.g = (this->super_Solver).game;
              local_40.v = this->strategy[uVar14];
              operator<<(poVar7,&local_40);
            }
          }
        }
        std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
      }
    }
  }
  uVar14 = 0;
  do {
    if (((this->super_Solver).game)->n_vertices <= (long)uVar14) {
      Solver::flush(&this->super_Solver);
      return;
    }
    if ((((this->super_Solver).disabled)->_bits[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) {
      iVar4 = (int)uVar14;
      if ((this->pm_nodes[(long)iVar4 * (long)this->k] == 0xffffffff) ||
         ((this->pm_nodes[(long)iVar4 * (long)this->k] & 1U) != this->pl)) {
        iVar5 = Solver::owner(&this->super_Solver,iVar4);
        iVar3 = this->pl;
        if ((iVar5 != iVar3) && (this->strategy[uVar14] == -1)) {
          this_00 = (Error *)__cxa_allocate_exception(0x40);
          Error::Error(this_00,"logic error",
                       "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/qpt.cpp"
                       ,0x1d4);
          __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
        }
        iVar6 = Solver::owner(&this->super_Solver,iVar4);
        iVar5 = -1;
        if (iVar6 != this->pl) {
          iVar5 = this->strategy[uVar14];
        }
        Solver::solve(&this->super_Solver,iVar4,1 - iVar3,iVar5);
      }
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void
QPTSolver::liftloop()
{
    /**
     * Initialize/reset progress measures / strategy
     */
    for (int i=0; i<k*nodecount(); i++) pm_nodes[i] = -1; // initialize all to _
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    /**
     * Run first lifting loop
     */
    for (int n=nodecount()-1; n>=0; n--) {
        if (disabled[n]) continue;
        lift_attempt++;
        if (lift(n, -1)) {
            lift_count++;
#if 0
            for (int from : in[n]) {
                if (disabled[from]) continue;
                lift_attempt++;
                if (lift(from, n)) {
                    lift_count++;
                    todo_push(from);
                }
            }
#else
            todo_push(n);
#endif
        }
    }

    /**
     * Lift until fixed point
     */
    while (!todo.empty()) {
        int n = todo_pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int from = *curedge;
            if (disabled[from]) continue;
            lift_attempt++;
            if (lift(from, n)) {
                lift_count++;
                todo_push(from);
            }
        }
    }

    /**
     * Report final state.
     */
    if (trace) {
        for (int v=0; v<nodecount(); v++) {
            if (disabled[v]) continue;
            int *pm = pm_nodes + v*k;

            logger << "\033[1m" << label_vertex(v) << (owner(v)?" (odd)":" (even)") << "\033[m:";
            pm_stream(logger, pm, k);

            if (pm[0] == -1 or (pm[0]&1) != pl) {
                if (owner(v) != pl) {
                    if (strategy[v] == -1) logger << " no strategy!";
                    else logger << " => " << label_vertex(strategy[v]);
                }
            }
            
            logger << std::endl;
        }
    }

    /**
     * Derive strategies, mark as solved (only for opponent).
     */
    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        int *pm = pm_nodes + v*k;

        if (pm[0] == -1 or (pm[0]&1) != pl) {
            if (owner(v) != pl and strategy[v] == -1) LOGIC_ERROR;
            Solver::solve(v, 1-pl, owner(v) != pl ? strategy[v] : -1);
        }
    }

    Solver::flush();
}